

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

void raviX_generate_C_tofile(LinearizerState *linearizer,char *mainfunc,FILE *fp)

{
  TextBuffer mb;
  
  if (mainfunc == (char *)0x0) {
    mainfunc = "setup";
  }
  raviX_string_copy(stub_compilerInterface.main_func_name,mainfunc,0x1f);
  raviX_buffer_init(&mb,0x1000);
  raviX_generate_C(linearizer,&mb,(Ravi_CompilerInterface *)0x0);
  fprintf((FILE *)fp,"%s\n",mb.buf);
  raviX_buffer_free(&mb);
  return;
}

Assistant:

void raviX_generate_C_tofile(LinearizerState *linearizer, const char *mainfunc, FILE *fp)
{
	struct Ravi_CompilerInterface *ravi_interface = &stub_compilerInterface;
	raviX_string_copy(ravi_interface->main_func_name, (mainfunc != NULL ? mainfunc : "setup"),
			  sizeof ravi_interface->main_func_name);
	TextBuffer mb;
	raviX_buffer_init(&mb, 4096);
	raviX_generate_C(linearizer, &mb, NULL);
	fprintf(fp, "%s\n", mb.buf);
	raviX_buffer_free(&mb);
}